

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1
          ,double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  undefined8 uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  
  lVar18 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  if (0 < lVar18) {
    auVar7 = vpmovsxbq_avx(ZEXT216(0xa05));
    auVar8 = vpmovsxbq_avx2(ZEXT416(0x100b0601));
    auVar9 = vpmovsxbq_avx2(ZEXT416(0x110c0702));
    auVar10 = vpmovsxbq_avx2(ZEXT416(0x120d0803));
    iVar5 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    lVar22 = 0;
    iVar19 = startPattern * 4;
    do {
      if (startPattern < endPattern) {
        lVar20 = (long)iVar19;
        lVar1 = lVar20 * 8;
        lVar2 = lVar20 * 8;
        pdVar3 = destP + lVar20;
        auVar23 = vpbroadcastq_avx512vl();
        auVar24 = vpbroadcastq_avx512vl();
        lVar21 = 0;
        auVar6 = vpaddq_avx(auVar23._0_16_,auVar7);
        vpaddq_avx2(auVar23,auVar8);
        vpaddq_avx2(auVar23,auVar9);
        vpaddq_avx2(auVar23,auVar10);
        auVar25 = vpermq_avx2(ZEXT1632(auVar6),0xd0);
        auVar25 = vpblendd_avx2(auVar25,auVar23,3);
        vpblendd_avx2(auVar25,auVar24,0xc0);
        auVar25 = vgatherqpd_avx512vl(matrices1[(long)matrices2]);
        auVar23 = vgatherqpd_avx512vl(matrices1[(long)pdVar3]);
        auVar24 = vgatherqpd_avx512vl(*matrices1);
        auVar26 = vgatherqpd_avx512vl(matrices1[lVar22]);
        auVar27 = vgatherqpd_avx512vl(*(undefined8 *)((long)matrices2 * 9));
        auVar28 = vgatherqpd_avx512vl(matrices2[(long)pdVar3]);
        auVar29 = vgatherqpd_avx512vl(*matrices2);
        auVar30 = vgatherqpd_avx512vl(matrices2[lVar22]);
        lVar20 = (long)endPattern - (long)startPattern;
        do {
          uVar4 = *(undefined8 *)((long)partials1 + lVar21 * 4 + lVar1 + 8);
          auVar31._8_8_ = uVar4;
          auVar31._0_8_ = uVar4;
          auVar31._16_8_ = uVar4;
          auVar31._24_8_ = uVar4;
          auVar31 = vmulpd_avx512vl(auVar23,auVar31);
          uVar4 = *(undefined8 *)((long)partials2 + lVar21 * 4 + lVar2 + 8);
          auVar32._8_8_ = uVar4;
          auVar32._0_8_ = uVar4;
          auVar32._16_8_ = uVar4;
          auVar32._24_8_ = uVar4;
          auVar32 = vmulpd_avx512vl(auVar28,auVar32);
          uVar4 = *(undefined8 *)((long)partials1 + lVar21 * 4 + lVar1);
          auVar11._8_8_ = uVar4;
          auVar11._0_8_ = uVar4;
          auVar11._16_8_ = uVar4;
          auVar11._24_8_ = uVar4;
          auVar31 = vfmadd231pd_avx512vl(auVar31,auVar25,auVar11);
          uVar4 = *(undefined8 *)((long)partials2 + lVar21 * 4 + lVar2);
          auVar12._8_8_ = uVar4;
          auVar12._0_8_ = uVar4;
          auVar12._16_8_ = uVar4;
          auVar12._24_8_ = uVar4;
          auVar32 = vfmadd231pd_avx512vl(auVar32,auVar27,auVar12);
          uVar4 = *(undefined8 *)((long)partials1 + lVar21 * 4 + lVar1 + 0x10);
          auVar13._8_8_ = uVar4;
          auVar13._0_8_ = uVar4;
          auVar13._16_8_ = uVar4;
          auVar13._24_8_ = uVar4;
          auVar31 = vfmadd231pd_avx512vl(auVar31,auVar24,auVar13);
          uVar4 = *(undefined8 *)((long)partials2 + lVar21 * 4 + lVar2 + 0x10);
          auVar14._8_8_ = uVar4;
          auVar14._0_8_ = uVar4;
          auVar14._16_8_ = uVar4;
          auVar14._24_8_ = uVar4;
          auVar32 = vfmadd231pd_avx512vl(auVar32,auVar29,auVar14);
          uVar4 = *(undefined8 *)((long)partials1 + lVar21 * 4 + lVar1 + 0x18);
          auVar15._8_8_ = uVar4;
          auVar15._0_8_ = uVar4;
          auVar15._16_8_ = uVar4;
          auVar15._24_8_ = uVar4;
          auVar31 = vfmadd231pd_avx512vl(auVar31,auVar26,auVar15);
          uVar4 = *(undefined8 *)((long)partials2 + lVar21 * 4 + lVar2 + 0x18);
          auVar16._8_8_ = uVar4;
          auVar16._0_8_ = uVar4;
          auVar16._16_8_ = uVar4;
          auVar16._24_8_ = uVar4;
          auVar32 = vfmadd231pd_avx512vl(auVar32,auVar30,auVar16);
          auVar33._0_8_ = auVar31._0_8_ * auVar32._0_8_;
          auVar33._8_8_ = auVar31._8_8_ * auVar32._8_8_;
          auVar33._16_8_ = auVar31._16_8_ * auVar32._16_8_;
          auVar33._24_8_ = auVar31._24_8_ * auVar32._24_8_;
          uVar4 = *(undefined8 *)((long)scaleFactors + lVar21 + (long)startPattern * 8);
          auVar17._8_8_ = uVar4;
          auVar17._0_8_ = uVar4;
          auVar17._16_8_ = uVar4;
          auVar17._24_8_ = uVar4;
          auVar31 = vdivpd_avx512vl(auVar33,auVar17);
          *(undefined1 (*) [32])((long)pdVar3 + lVar21 * 4) = auVar31;
          lVar21 = lVar21 + 8;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      lVar22 = lVar22 + 1;
      iVar19 = iVar19 + iVar5 * 4;
    } while (lVar22 != lVar18);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                               const REALTYPE* partials1,
                                                                               const REALTYPE* matrices1,
                                                                               const REALTYPE* partials2,
                                                                               const REALTYPE* matrices2,
                                                                               const REALTYPE* scaleFactors,
                                                                               int startPattern,
                                                                               int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }

        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);

        for (int k = startPattern; k < endPattern; k++) {

            // Prefetch scale factor
            const REALTYPE scaleFactor = scaleFactors[k];

            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20 / scaleFactor;
            destP[u + 1] = sum11 * sum21 / scaleFactor;
            destP[u + 2] = sum12 * sum22 / scaleFactor;
            destP[u + 3] = sum13 * sum23 / scaleFactor;

            u += 4;
        }
    }
}